

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFieldsWithPattern
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UVector *patternItems,
          UBool forceSingleHourDigit,int32_t *hour,int32_t *min,int32_t *sec)

{
  short sVar1;
  int32_t *piVar2;
  UBool UVar3;
  int8_t iVar4;
  int iVar5;
  int iVar6;
  UChar32 c;
  void *pvVar7;
  int iVar8;
  UChar *s;
  int index;
  uint c_00;
  int iVar9;
  int32_t iVar10;
  bool bVar11;
  int32_t len;
  uint local_70;
  int32_t local_6c;
  int32_t local_68;
  int32_t local_64;
  UnicodeString *local_60;
  TimeZoneFormat *local_58;
  int32_t local_4c;
  int32_t *local_48;
  ulong local_40;
  UVector *local_38;
  
  iVar9 = start;
  if (patternItems->count < 1) {
    bVar11 = true;
    local_64 = 0;
    local_68 = 0;
    local_6c = 0;
  }
  else {
    local_40 = (ulong)(byte)((forceSingleHourDigit == '\0') + 1);
    local_70 = 0;
    local_6c = 0;
    local_68 = 0;
    local_64 = 0;
    index = 0;
    local_60 = text;
    local_58 = this;
    local_38 = patternItems;
    do {
      len = 0;
      pvVar7 = UVector::elementAt(patternItems,index);
      switch(*(undefined4 *)((long)pvVar7 + 0x10)) {
      case 0:
        s = *(UChar **)((long)pvVar7 + 8);
        iVar5 = u_strlen_63(s);
        iVar10 = iVar5;
        piVar2 = local_48;
        if (index == 0) {
          sVar1 = (local_60->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar6 = (local_60->fUnion).fFields.fLength;
          }
          else {
            iVar6 = (int)sVar1 >> 5;
          }
          if (iVar9 < iVar6) {
            len = iVar5;
            c = UnicodeString::char32At(local_60,iVar9);
            UVar3 = PatternProps::isWhiteSpace(c);
            iVar10 = len;
            piVar2 = local_48;
            local_48 = hour;
            iVar6 = len;
            if (UVar3 == '\0') {
              do {
                hour = local_48;
                iVar10 = iVar6;
                if (iVar5 < 1) break;
                c_00 = (uint)(ushort)*s;
                if (((((c_00 & 0xf800) == 0xd800) && (((ushort)*s >> 10 & 1) == 0)) && (iVar6 != 1))
                   && (((ushort)s[1] & 0xfc00) == 0xdc00)) {
                  c_00 = c_00 * 0x400 + (uint)(ushort)s[1] + 0xfca02400;
                }
                local_4c = start;
                UVar3 = PatternProps::isWhiteSpace(c_00);
                iVar8 = 2 - (uint)(c_00 < 0x10000);
                iVar5 = iVar6 - iVar8;
                if (UVar3 == '\0') {
                  iVar8 = 0;
                }
                s = (UChar *)((long)s + (ulong)(uint)(iVar8 * 2));
                hour = local_48;
                start = local_4c;
                piVar2 = local_48;
                iVar6 = iVar5;
              } while (UVar3 != '\0');
            }
          }
        }
        local_48 = piVar2;
        len = iVar10;
        text = local_60;
        iVar4 = UnicodeString::doCaseCompare(local_60,iVar9,len,s,0,len,0);
        bVar11 = iVar4 == '\0';
        if (!bVar11) {
          len = 0;
        }
        local_70 = local_70 & 0xff;
        if (!bVar11) {
          local_70 = 1;
        }
        iVar9 = iVar9 + len;
        patternItems = local_38;
        goto LAB_001f86ef;
      case 1:
        local_6c = parseOffsetFieldWithLocalizedDigits
                             (local_58,text,iVar9,'\x01',(uint8_t)local_40,0,0x17,&len);
        break;
      case 2:
        local_68 = parseOffsetFieldWithLocalizedDigits
                             (local_58,text,iVar9,'\x02','\x02',0,0x3b,&len);
        break;
      case 4:
        local_64 = parseOffsetFieldWithLocalizedDigits
                             (local_58,text,iVar9,'\x02','\x02',0,0x3b,&len);
      }
      if (len == 0) {
        local_70 = 1;
        bVar11 = false;
      }
      else {
        iVar9 = iVar9 + len;
        bVar11 = true;
      }
LAB_001f86ef:
    } while ((bVar11) && (index = index + 1, index < patternItems->count));
    bVar11 = (char)local_70 == '\0';
  }
  if (bVar11) {
    *hour = local_6c;
    *min = local_68;
    *sec = local_64;
    iVar10 = iVar9 - start;
  }
  else {
    iVar10 = 0;
    *sec = 0;
    *min = 0;
    *hour = 0;
  }
  return iVar10;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFieldsWithPattern(const UnicodeString& text, int32_t start,
        UVector* patternItems, UBool forceSingleHourDigit, int32_t& hour, int32_t& min, int32_t& sec) const {
    UBool failed = FALSE;
    int32_t offsetH, offsetM, offsetS;
    offsetH = offsetM = offsetS = 0;
    int32_t idx = start;

    for (int32_t i = 0; i < patternItems->size(); i++) {
        int32_t len = 0;
        const GMTOffsetField* field = (const GMTOffsetField*)patternItems->elementAt(i);
        GMTOffsetField::FieldType fieldType = field->getType();
        if (fieldType == GMTOffsetField::TEXT) {
            const UChar* patStr = field->getPatternText();
            len = u_strlen(patStr);
            if (i == 0) {
                // When TimeZoneFormat parse() is called from SimpleDateFormat,
                // leading space characters might be truncated. If the first pattern text
                // starts with such character (e.g. Bidi control), then we need to
                // skip the leading space charcters.
                if (idx < text.length() && !PatternProps::isWhiteSpace(text.char32At(idx))) {
                    while (len > 0) {
                        UChar32 ch;
                        int32_t chLen;
                        U16_GET(patStr, 0, 0, len, ch)
                        if (PatternProps::isWhiteSpace(ch)) {
                            chLen = U16_LENGTH(ch);
                            len -= chLen;
                            patStr += chLen;
                        }
                        else {
                            break;
                        }
                    }
                }
            }
            if (text.caseCompare(idx, len, patStr, 0) != 0) {
                failed = TRUE;
                break;
            }
            idx += len;
        } else {
            if (fieldType == GMTOffsetField::HOUR) {
                uint8_t maxDigits = forceSingleHourDigit ? 1 : 2;
                offsetH = parseOffsetFieldWithLocalizedDigits(text, idx, 1, maxDigits, 0, MAX_OFFSET_HOUR, len);
            } else if (fieldType == GMTOffsetField::MINUTE) {
                offsetM = parseOffsetFieldWithLocalizedDigits(text, idx, 2, 2, 0, MAX_OFFSET_MINUTE, len);
            } else if (fieldType == GMTOffsetField::SECOND) {
                offsetS = parseOffsetFieldWithLocalizedDigits(text, idx, 2, 2, 0, MAX_OFFSET_SECOND, len);
            }

            if (len == 0) {
                failed = TRUE;
                break;
            }
            idx += len;
        }
    }

    if (failed) {
        hour = min = sec = 0;
        return 0;
    }

    hour = offsetH;
    min = offsetM;
    sec = offsetS;

    return idx - start;
}